

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
anurbs::RTree<3L>::by_box
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,RTree<3L> *this,Vector *box_a
          ,Vector *box_b,Callback *callback)

{
  double dVar1;
  Index i;
  long lVar2;
  double dVar3;
  double dVar4;
  PickByBox check;
  _Any_data _Stack_a8;
  code *local_98;
  double local_88 [4];
  double local_68 [4];
  PickByBox local_48;
  
  local_68[0] = (box_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[0];
  local_68[1] = (box_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[1];
  local_68[2] = (box_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[2];
  local_88[0] = (box_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[0];
  local_88[1] = (box_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[1];
  local_88[2] = (box_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[2];
  lVar2 = 0;
  do {
    dVar1 = local_68[lVar2];
    dVar3 = local_88[lVar2];
    dVar4 = dVar1;
    if (dVar3 <= dVar1) {
      dVar4 = dVar3;
    }
    local_48.m_box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
    .array[lVar2] = dVar4;
    if (dVar3 <= dVar1) {
      dVar3 = dVar1;
    }
    *(double *)
     ((long)local_48.m_box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
            m_storage.m_data.array + lVar2 * 8) = dVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  std::function<bool_(long)>::function((function<bool_(long)> *)&_Stack_a8,callback);
  RTree<3l>::search<anurbs::RTree<3l>::PickByBox>
            (__return_storage_ptr__,this,&local_48,(Callback *)&_Stack_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&_Stack_a8,&_Stack_a8,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> by_box(const Vector box_a, const Vector box_b, Callback callback=nullptr)
    {
        PickByBox check(box_a, box_b);
        return search(check, callback);
    }